

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cRGB,cBGRA,bAdd>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  EBlend EVar3;
  FSpecialColormap *pFVar4;
  long lVar5;
  BYTE BVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  byte *pbVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  
  pFVar4 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_0063d76c_caseD_0:
    if (0 < count) {
      pbVar11 = pin + 2;
      lVar5 = 0;
      do {
        iVar9 = (int)((uint)pbVar11[-2] * inf->alpha + (uint)pout[lVar5 * 4 + 2] * 0x10000) >> 0x10;
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        pout[lVar5 * 4 + 2] = (BYTE)iVar9;
        iVar9 = (int)((uint)pbVar11[-1] * inf->alpha + (uint)pout[lVar5 * 4 + 1] * 0x10000) >> 0x10;
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        pout[lVar5 * 4 + 1] = (BYTE)iVar9;
        iVar9 = (int)((uint)*pbVar11 * inf->alpha + (uint)pout[lVar5 * 4] * 0x10000) >> 0x10;
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        pout[lVar5 * 4] = (BYTE)iVar9;
        pout[lVar5 * 4 + 3] = 0xff;
        lVar5 = lVar5 + 1;
        pbVar11 = pbVar11 + step;
      } while (count != (int)lVar5);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_0063d76c_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        pbVar11 = pin + 2;
        lVar5 = 0;
        do {
          uVar13 = (uint)pbVar11[-1] * 0x8f + (uint)pbVar11[-2] * 0x4d +
                   ((uint)*pbVar11 + (uint)*pbVar11 * 8) * 4 >> 0xc;
          iVar9 = (int)((uint)IcePalette[uVar13][0] * inf->alpha +
                       (uint)pout[lVar5 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar5 * 4 + 2] = (BYTE)iVar9;
          iVar9 = (int)((uint)IcePalette[uVar13][1] * inf->alpha +
                       (uint)pout[lVar5 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar5 * 4 + 1] = (BYTE)iVar9;
          iVar9 = (int)((uint)IcePalette[uVar13][2] * inf->alpha + (uint)pout[lVar5 * 4] * 0x10000)
                  >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar5 * 4] = (BYTE)iVar9;
          pout[lVar5 * 4 + 3] = 0xff;
          lVar5 = lVar5 + 1;
          pbVar11 = pbVar11 + step;
        } while (count != (int)lVar5);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        pbVar11 = pin + 2;
        lVar5 = 0;
        do {
          iVar9 = inf->blendcolor[3];
          iVar7 = (int)(((uint)pbVar11[-2] * iVar9 + inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha
                       + (uint)pout[lVar5 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          bVar1 = pbVar11[-1];
          iVar10 = inf->blendcolor[1];
          bVar2 = *pbVar11;
          iVar14 = inf->blendcolor[2];
          pout[lVar5 * 4 + 2] = (BYTE)iVar7;
          iVar7 = (int)(((uint)bVar1 * iVar9 + iVar10 >> 0x10 & 0xff) * inf->alpha +
                       (uint)pout[lVar5 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          pout[lVar5 * 4 + 1] = (BYTE)iVar7;
          iVar9 = (int)(((uint)bVar2 * iVar9 + iVar14 >> 0x10 & 0xff) * inf->alpha +
                       (uint)pout[lVar5 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar5 * 4] = (BYTE)iVar9;
          pout[lVar5 * 4 + 3] = 0xff;
          lVar5 = lVar5 + 1;
          pbVar11 = pbVar11 + step;
        } while (count != (int)lVar5);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        pbVar11 = pin + 2;
        lVar5 = 0;
        do {
          iVar9 = (int)(((uint)pbVar11[-2] * inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                       (uint)pout[lVar5 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          bVar1 = pbVar11[-1];
          iVar7 = inf->blendcolor[1];
          bVar2 = *pbVar11;
          iVar10 = inf->blendcolor[2];
          pout[lVar5 * 4 + 2] = (BYTE)iVar9;
          iVar9 = (int)(((uint)bVar1 * iVar7 >> 0x10 & 0xff) * inf->alpha +
                       (uint)pout[lVar5 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar5 * 4 + 1] = (BYTE)iVar9;
          iVar9 = (int)(((uint)bVar2 * iVar10 >> 0x10 & 0xff) * inf->alpha +
                       (uint)pout[lVar5 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar5 * 4] = (BYTE)iVar9;
          pout[lVar5 * 4 + 3] = 0xff;
          lVar5 = lVar5 + 1;
          pbVar11 = pbVar11 + step;
        } while (count != (int)lVar5);
      }
      break;
    default:
      EVar3 = inf->blend;
      lVar5 = (long)EVar3;
      if (lVar5 < 0x21) {
        if ((BLEND_ICEMAP < EVar3) && (0 < count)) {
          iVar9 = 0x20 - EVar3;
          pbVar11 = pin + 2;
          lVar5 = 0;
          do {
            bVar1 = *pbVar11;
            iVar10 = ((uint)pbVar11[-1] * 0x8f + (uint)pbVar11[-2] * 0x4d +
                      ((uint)bVar1 + (uint)bVar1 * 8) * 4 >> 8) * (EVar3 + BLEND_MODULATE);
            iVar7 = (uint)pbVar11[-2] * iVar9 + iVar10;
            iVar14 = (uint)pbVar11[-1] * iVar9 + iVar10;
            iVar10 = (uint)bVar1 * iVar9 + iVar10;
            iVar7 = ((uint)((ulong)((long)iVar7 * 0x84210843) >> 0x24) - (iVar7 >> 0x1f) & 0xff) *
                    inf->alpha + (uint)pout[lVar5 * 4 + 2] * 0x10000;
            BVar6 = (BYTE)((uint)iVar7 >> 0x10);
            if (0xfe < iVar7 >> 0x10) {
              BVar6 = 0xff;
            }
            pout[lVar5 * 4 + 2] = BVar6;
            iVar7 = ((uint)((ulong)((long)iVar14 * 0x84210843) >> 0x24) - (iVar14 >> 0x1f) & 0xff) *
                    inf->alpha + (uint)pout[lVar5 * 4 + 1] * 0x10000;
            BVar6 = (BYTE)((uint)iVar7 >> 0x10);
            if (0xfe < iVar7 >> 0x10) {
              BVar6 = 0xff;
            }
            pout[lVar5 * 4 + 1] = BVar6;
            iVar7 = ((uint)((ulong)((long)iVar10 * 0x84210843) >> 0x24) - (iVar10 >> 0x1f) & 0xff) *
                    inf->alpha + (uint)pout[lVar5 * 4] * 0x10000;
            BVar6 = (BYTE)((uint)iVar7 >> 0x10);
            if (0xfe < iVar7 >> 0x10) {
              BVar6 = 0xff;
            }
            pout[lVar5 * 4] = BVar6;
            pout[lVar5 * 4 + 3] = 0xff;
            lVar5 = lVar5 + 1;
            pbVar11 = pbVar11 + step;
          } while (count != (int)lVar5);
        }
      }
      else if (0 < count) {
        pbVar11 = pin + 2;
        lVar12 = 0;
        do {
          uVar8 = (ulong)((uint)pbVar11[-1] * 0x8f + (uint)pbVar11[-2] * 0x4d +
                          ((uint)*pbVar11 + (uint)*pbVar11 * 8) * 4 >> 8);
          iVar9 = (int)((uint)*(byte *)((long)pFVar4 + uVar8 * 4 + lVar5 * 0x518 + -0xa6fe) *
                        inf->alpha + (uint)pout[lVar12 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          bVar1 = *(byte *)((long)pFVar4 + uVar8 * 4 + lVar5 * 0x518 + -0xa700);
          bVar2 = *(byte *)((long)pFVar4 + uVar8 * 4 + lVar5 * 0x518 + -0xa6ff);
          pout[lVar12 * 4 + 2] = (BYTE)iVar9;
          iVar9 = (int)((uint)bVar2 * inf->alpha + (uint)pout[lVar12 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar12 * 4 + 1] = (BYTE)iVar9;
          iVar9 = (int)((uint)bVar1 * inf->alpha + (uint)pout[lVar12 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          pout[lVar12 * 4] = (BYTE)iVar9;
          pout[lVar12 * 4 + 3] = 0xff;
          lVar12 = lVar12 + 1;
          pbVar11 = pbVar11 + step;
        } while (count != (int)lVar12);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}